

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTContext::evalRangeDimension
          (ASTContext *this,SelectorSyntax *syntax,bool isPacked,EvaluatedDimension *result)

{
  int32_t left_00;
  SourceRange range;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  optional<int> value_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *pTVar3;
  int *piVar4;
  uint64_t uVar5;
  EvaluatedDimension *in_RCX;
  byte in_DL;
  SyntaxNode *in_RSI;
  undefined8 in_RDI;
  uint64_t fullWidth;
  optional<int> right;
  optional<int> left;
  RangeSelectSyntax *rangeSyntax;
  optional<int> value;
  Expression *expr;
  ExpressionSyntax *in_stack_fffffffffffffea8;
  Diagnostic *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  SymbolKind in_stack_fffffffffffffebc;
  SourceLocation in_stack_fffffffffffffec0;
  undefined4 uVar6;
  _Storage<int,_true> _Var7;
  undefined4 in_stack_fffffffffffffed0;
  DiagCode code;
  SyntaxNode *in_stack_fffffffffffffef0;
  ConstantRange local_c0;
  bitmask<slang::ast::ASTFlags> local_b8;
  _Optional_payload_base<int> local_b0;
  bitmask<slang::ast::ASTFlags> local_a8;
  _Optional_payload_base<int> local_a0;
  RangeSelectSyntax *local_98;
  ConstantRange local_90;
  SourceRange local_88;
  _Optional_payload_base<int> local_74;
  bitmask<slang::ast::EvalFlags> local_69;
  _Optional_payload_base<int> local_68;
  SourceLocation local_60;
  Expression *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  bitmask<slang::ast::EvalFlags> extraFlags_01;
  bitmask<slang::ast::ASTFlags> local_30;
  Diagnostic *local_28;
  EvaluatedDimension *local_20;
  byte local_11;
  Diagnostic *this_00;
  
  extraFlags_01.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  local_11 = in_DL & 1;
  uVar6 = (undefined4)in_RDI;
  _Var7._M_value = (int)((ulong)in_RDI >> 0x20);
  code = (DiagCode)in_RSI->kind;
  local_20 = in_RCX;
  if (code == (DiagCode)0x35) {
    slang::syntax::SyntaxNode::as<slang::syntax::BitSelectSyntax>(in_RSI);
    in_stack_fffffffffffffec0 =
         (SourceLocation)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x82a679);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_30,AllowDataType);
    iVar2 = Expression::bind(in_stack_fffffffffffffec0._0_4_,
                             (sockaddr *)CONCAT44(_Var7._M_value,uVar6),(socklen_t)local_30.m_bits);
    this_00 = (Diagnostic *)CONCAT44(extraout_var,iVar2);
    local_28 = this_00;
    if (*(ExpressionKind *)
         &(this_00->args).
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == DataType) {
      local_20->kind = Associative;
      Expression::as<slang::ast::DataTypeExpression>((Expression *)this_00);
      pTVar3 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x82a6e7);
      local_20->associativeType = pTVar3;
      in_stack_fffffffffffffebc = (local_20->associativeType->super_Symbol).kind;
      if ((in_stack_fffffffffffffebc == EnumType) ||
         (in_stack_fffffffffffffebc - PackedStructType < 4)) {
        sourceRange.endLoc._0_4_ = uVar6;
        sourceRange.startLoc = in_stack_fffffffffffffec0;
        sourceRange.endLoc._4_4_ = _Var7._M_value;
        addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),code,
                sourceRange);
        return;
      }
      bVar1 = checkIndexType((Type *)CONCAT44(_Var7._M_value,uVar6));
      if (!bVar1) {
        local_60 = ((SourceRange *)
                   &(local_28->ranges).
                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->startLoc;
        sourceRange_00.endLoc._0_4_ = uVar6;
        sourceRange_00.startLoc = in_stack_fffffffffffffec0;
        sourceRange_00.endLoc._4_4_ = _Var7._M_value;
        addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),code,
                sourceRange_00);
      }
    }
    else {
      memset(&local_69,0,1);
      bitmask<slang::ast::EvalFlags>::bitmask(&local_69);
      local_74 = (_Optional_payload_base<int>)
                 evalInteger((ASTContext *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8,extraFlags_01);
      local_68 = local_74;
      local_88 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
      value_00.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _4_4_ = in_stack_fffffffffffffed0;
      value_00.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = _Var7._M_value;
      range.startLoc._4_4_ = in_stack_fffffffffffffebc;
      range.startLoc._0_4_ = in_stack_fffffffffffffeb8;
      range.endLoc = in_stack_fffffffffffffec0;
      bVar1 = requireGtZero((ASTContext *)this_00,value_00,range);
      if (!bVar1) {
        return;
      }
      local_20->kind = AbbreviatedRange;
      piVar4 = std::optional<int>::operator*((optional<int> *)0x82a89a);
      ConstantRange::ConstantRange(&local_90,0,*piVar4 + -1);
      local_20->range = local_90;
      in_stack_fffffffffffffeb0 = this_00;
    }
  }
  else {
    if (code != (DiagCode)0x1b0) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
      sourceRange_01.endLoc._0_4_ = uVar6;
      sourceRange_01.startLoc = in_stack_fffffffffffffec0;
      sourceRange_01.endLoc._4_4_ = _Var7._M_value;
      addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),code,
              sourceRange_01);
      return;
    }
    local_98 = slang::syntax::SyntaxNode::as<slang::syntax::RangeSelectSyntax>(in_RSI);
    not_null<slang::syntax::ExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x82a8ed);
    memset(&local_a8,0,8);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_a8);
    extraFlags.m_bits._4_4_ = _Var7._M_value;
    extraFlags.m_bits._0_4_ = uVar6;
    local_a0 = (_Optional_payload_base<int>)
               evalInteger((ASTContext *)in_stack_fffffffffffffec0,
                           (ExpressionSyntax *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),extraFlags)
    ;
    in_stack_fffffffffffffea8 =
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x82a943);
    memset(&local_b8,0,8);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_b8);
    extraFlags_00.m_bits._4_4_ = _Var7._M_value;
    extraFlags_00.m_bits._0_4_ = uVar6;
    local_b0 = (_Optional_payload_base<int>)
               evalInteger((ASTContext *)in_stack_fffffffffffffec0,
                           (ExpressionSyntax *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           extraFlags_00);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x82a995);
    if (!bVar1) {
      return;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x82a9a8);
    if (!bVar1) {
      return;
    }
    local_20->kind = Range;
    piVar4 = std::optional<int>::operator*((optional<int> *)0x82a9cc);
    left_00 = *piVar4;
    piVar4 = std::optional<int>::operator*((optional<int> *)0x82a9df);
    ConstantRange::ConstantRange(&local_c0,left_00,*piVar4);
    local_20->range = local_c0;
  }
  bVar1 = EvaluatedDimension::isRange(local_20);
  if (bVar1) {
    if (((local_11 & 1) == 0) || (local_20->kind != AbbreviatedRange)) {
      uVar5 = ConstantRange::fullWidth(&local_20->range);
      if (((local_11 & 1) == 0) || (uVar5 < 0x1000000)) {
        if (((local_11 & 1) == 0) && (0x7fffffff < uVar5)) {
          slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
          sourceRange_04.endLoc._0_4_ = uVar6;
          sourceRange_04.startLoc = in_stack_fffffffffffffec0;
          sourceRange_04.endLoc._4_4_ = _Var7._M_value;
          addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),code,
                  sourceRange_04);
          Diagnostic::operator<<<unsigned_long>
                    (in_stack_fffffffffffffeb0,(unsigned_long)in_stack_fffffffffffffea8);
          Diagnostic::operator<<<int>
                    (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
          local_20->kind = Unknown;
        }
      }
      else {
        slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
        sourceRange_03.endLoc._0_4_ = uVar6;
        sourceRange_03.startLoc = in_stack_fffffffffffffec0;
        sourceRange_03.endLoc._4_4_ = _Var7._M_value;
        addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),code,
                sourceRange_03);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffffeb0,(unsigned_long)in_stack_fffffffffffffea8);
        Diagnostic::operator<<<int>
                  (in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        local_20->kind = Unknown;
      }
    }
    else {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
      sourceRange_02.endLoc._0_4_ = uVar6;
      sourceRange_02.startLoc = in_stack_fffffffffffffec0;
      sourceRange_02.endLoc._4_4_ = _Var7._M_value;
      addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),code,
              sourceRange_02);
      local_20->kind = Unknown;
    }
  }
  return;
}

Assistant:

void ASTContext::evalRangeDimension(const SelectorSyntax& syntax, bool isPacked,
                                    EvaluatedDimension& result) const {
    switch (syntax.kind) {
        case SyntaxKind::BitSelect: {
            auto& expr = Expression::bind(*syntax.as<BitSelectSyntax>().expr, *this,
                                          ASTFlags::AllowDataType);

            // If this expression is actually a data type, this is an associative array dimension
            // instead of a normal packed / unpacked array.
            if (expr.kind == ExpressionKind::DataType) {
                result.kind = DimensionKind::Associative;
                result.associativeType = expr.as<DataTypeExpression>().type;
                switch (result.associativeType->kind) {
                    case SymbolKind::PackedStructType:
                    case SymbolKind::PackedUnionType:
                    case SymbolKind::UnpackedStructType:
                    case SymbolKind::UnpackedUnionType:
                    case SymbolKind::EnumType:
                        addDiag(diag::CannotDeclareType, expr.sourceRange);
                        return;
                    default:
                        break;
                }

                // It's invalid for the index type to be floating or having floating members.
                if (!checkIndexType(*result.associativeType))
                    addDiag(diag::InvalidAssociativeIndexType, expr.sourceRange);
            }
            else {
                auto value = evalInteger(expr);
                if (!requireGtZero(value, syntax.sourceRange()))
                    return;

                result.kind = DimensionKind::AbbreviatedRange;
                result.range = {0, *value - 1};
            }
            break;
        }
        case SyntaxKind::SimpleRangeSelect: {
            auto& rangeSyntax = syntax.as<RangeSelectSyntax>();
            auto left = evalInteger(*rangeSyntax.left);
            auto right = evalInteger(*rangeSyntax.right);
            if (!left || !right)
                return;

            result.kind = DimensionKind::Range;
            result.range = {*left, *right};
            break;
        }
        default:
            addDiag(diag::InvalidDimensionRange, syntax.sourceRange());
            return;
    }

    if (result.isRange()) {
        if (isPacked && result.kind == DimensionKind::AbbreviatedRange) {
            addDiag(diag::PackedDimsRequireFullRange, syntax.sourceRange());
            result.kind = DimensionKind::Unknown;
        }
        else {
            auto fullWidth = result.range.fullWidth();
            if (isPacked && fullWidth > SVInt::MAX_BITS) {
                addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                    << fullWidth << (int)SVInt::MAX_BITS;
                result.kind = DimensionKind::Unknown;
            }
            else if (!isPacked && fullWidth > INT32_MAX) {
                addDiag(diag::ArrayDimTooLarge, syntax.sourceRange()) << fullWidth << INT32_MAX;
                result.kind = DimensionKind::Unknown;
            }
        }
    }
}